

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int FindWindowIndex(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  int local_24;
  int i;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  local_24 = (GImGui->Windows).Size;
  do {
    local_24 = local_24 + -1;
    if (local_24 < 0) {
      return -1;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,local_24);
  } while (*ppIVar2 != window);
  return local_24;
}

Assistant:

static int FindWindowIndex(ImGuiWindow* window) // FIXME-OPT O(N)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size-1; i >= 0; i--)
        if (g.Windows[i] == window)
            return i;
    return -1;
}